

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_pk8.cc
# Opt level: O0

int do_pk8pkey(BIO *bp,EVP_PKEY *x,int isder,int nid,EVP_CIPHER *enc,char *pass,int pass_len,
              pem_password_cb *cb,void *u)

{
  X509_SIG *x_00;
  int local_44c;
  undefined1 local_448 [4];
  int ret;
  char buf [1024];
  PKCS8_PRIV_KEY_INFO *p8inf;
  X509_SIG *p8;
  char *pass_local;
  EVP_CIPHER *enc_local;
  int nid_local;
  int isder_local;
  EVP_PKEY *x_local;
  BIO *bp_local;
  
  buf._1016_8_ = EVP_PKEY2PKCS8((EVP_PKEY *)x);
  if ((PKCS8_PRIV_KEY_INFO *)buf._1016_8_ == (PKCS8_PRIV_KEY_INFO *)0x0) {
    ERR_put_error(9,0,0x6a,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_pk8.cc"
                  ,0x45);
    bp_local._4_4_ = 0;
  }
  else if ((enc == (EVP_CIPHER *)0x0) && (nid == -1)) {
    if (isder == 0) {
      local_44c = PEM_write_bio_PKCS8_PRIV_KEY_INFO((BIO *)bp,(PKCS8_PRIV_KEY_INFO *)buf._1016_8_);
    }
    else {
      local_44c = i2d_PKCS8_PRIV_KEY_INFO_bio((BIO *)bp,(PKCS8_PRIV_KEY_INFO *)buf._1016_8_);
    }
    PKCS8_PRIV_KEY_INFO_free((PKCS8_PRIV_KEY_INFO *)buf._1016_8_);
    bp_local._4_4_ = local_44c;
  }
  else {
    p8 = (X509_SIG *)pass;
    if (pass == (char *)0x0) {
      if (cb == (pem_password_cb *)0x0) {
        cb = PEM_def_callback;
      }
      pass_len = (*cb)(local_448,0x400,1,u);
      if (pass_len < 0) {
        ERR_put_error(9,0,0x6f,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_pk8.cc"
                      ,0x4f);
        PKCS8_PRIV_KEY_INFO_free((PKCS8_PRIV_KEY_INFO *)buf._1016_8_);
        return 0;
      }
      p8 = (X509_SIG *)local_448;
    }
    x_00 = PKCS8_encrypt(nid,(EVP_CIPHER *)enc,(char *)p8,pass_len,(uchar *)0x0,0,0,
                         (PKCS8_PRIV_KEY_INFO *)buf._1016_8_);
    if (p8 == (X509_SIG *)local_448) {
      OPENSSL_cleanse(local_448,(long)pass_len);
    }
    PKCS8_PRIV_KEY_INFO_free((PKCS8_PRIV_KEY_INFO *)buf._1016_8_);
    if (isder == 0) {
      local_44c = PEM_write_bio_PKCS8((BIO *)bp,x_00);
    }
    else {
      local_44c = i2d_PKCS8_bio((BIO *)bp,x_00);
    }
    X509_SIG_free(x_00);
    bp_local._4_4_ = local_44c;
  }
  return bp_local._4_4_;
}

Assistant:

static int do_pk8pkey(BIO *bp, const EVP_PKEY *x, int isder, int nid,
                      const EVP_CIPHER *enc, const char *pass, int pass_len,
                      pem_password_cb *cb, void *u) {
  X509_SIG *p8;
  PKCS8_PRIV_KEY_INFO *p8inf;
  char buf[PEM_BUFSIZE];
  int ret;
  if (!(p8inf = EVP_PKEY2PKCS8(x))) {
    OPENSSL_PUT_ERROR(PEM, PEM_R_ERROR_CONVERTING_PRIVATE_KEY);
    return 0;
  }
  if (enc || (nid != -1)) {
    if (!pass) {
      if (!cb) {
        cb = PEM_def_callback;
      }
      pass_len = cb(buf, PEM_BUFSIZE, 1, u);
      if (pass_len < 0) {
        OPENSSL_PUT_ERROR(PEM, PEM_R_READ_KEY);
        PKCS8_PRIV_KEY_INFO_free(p8inf);
        return 0;
      }

      pass = buf;
    }
    p8 = PKCS8_encrypt(nid, enc, pass, pass_len, NULL, 0, 0, p8inf);
    if (pass == buf) {
      OPENSSL_cleanse(buf, pass_len);
    }
    PKCS8_PRIV_KEY_INFO_free(p8inf);
    if (isder) {
      ret = i2d_PKCS8_bio(bp, p8);
    } else {
      ret = PEM_write_bio_PKCS8(bp, p8);
    }
    X509_SIG_free(p8);
    return ret;
  } else {
    if (isder) {
      ret = i2d_PKCS8_PRIV_KEY_INFO_bio(bp, p8inf);
    } else {
      ret = PEM_write_bio_PKCS8_PRIV_KEY_INFO(bp, p8inf);
    }
    PKCS8_PRIV_KEY_INFO_free(p8inf);
    return ret;
  }
}